

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

void checksum_update(chksumwork_conflict *sumwrk,void *buff,size_t size)

{
  sumalg sVar1;
  size_t size_local;
  void *buff_local;
  chksumwork_conflict *sumwrk_local;
  
  sVar1 = sumwrk->alg;
  if (sVar1 != CKSUM_NONE) {
    if (sVar1 == CKSUM_SHA1) {
      __archive_sha1update(&sumwrk->sha1ctx,buff,size);
    }
    else if (sVar1 == CKSUM_MD5) {
      __archive_md5update(&sumwrk->md5ctx,buff,size);
    }
  }
  return;
}

Assistant:

static void
_checksum_update(struct chksumwork *sumwrk, const void *buff, size_t size)
{

	switch (sumwrk->alg) {
	case CKSUM_NONE:
		break;
	case CKSUM_SHA1:
		archive_sha1_update(&(sumwrk->sha1ctx), buff, size);
		break;
	case CKSUM_MD5:
		archive_md5_update(&(sumwrk->md5ctx), buff, size);
		break;
	}
}